

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::RemoveShape
          (MutableS2ShapeIndex *this,RemovedShape *removed,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges,InteriorTracker *tracker)

{
  pointer pEVar1;
  InteriorTracker *this_00;
  Edge *removed_edge;
  pointer pEVar2;
  FaceEdge local_90;
  
  local_90.b.c_[0] = 0.0;
  local_90.b.c_[1] = 0.0;
  local_90.a.c_[0] = 0.0;
  local_90.a.c_[1] = 0.0;
  local_90.edge_id = -1;
  local_90.shape_id = removed->shape_id;
  local_90.has_interior = removed->has_interior;
  this_00 = (InteriorTracker *)this;
  if (local_90.has_interior == true) {
    InteriorTracker::AddShape(tracker,local_90.shape_id,removed->contains_tracker_origin);
    this_00 = tracker;
  }
  pEVar1 = (removed->edges).super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (removed->edges).super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    local_90.edge.v0.c_[0] = (pEVar2->v0).c_[0];
    local_90.edge.v0.c_[1] = (pEVar2->v0).c_[1];
    local_90.edge.v0.c_[2] = (pEVar2->v0).c_[2];
    local_90.edge.v1.c_[0] = (pEVar2->v1).c_[0];
    local_90.edge.v1.c_[1] = (pEVar2->v1).c_[1];
    local_90.edge.v1.c_[2] = (pEVar2->v1).c_[2];
    local_90.max_level = GetEdgeMaxLevel((MutableS2ShapeIndex *)this_00,&local_90.edge);
    this_00 = (InteriorTracker *)this;
    AddFaceEdge(this,&local_90,all_edges);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::RemoveShape(const RemovedShape& removed,
                                      vector<FaceEdge> all_edges[6],
                                      InteriorTracker* tracker) const {
  FaceEdge edge;
  edge.edge_id = -1;  // Not used or needed for removed edges.
  edge.shape_id = removed.shape_id;
  edge.has_interior = removed.has_interior;
  if (edge.has_interior) {
    tracker->AddShape(edge.shape_id, removed.contains_tracker_origin);
  }
  for (const auto& removed_edge : removed.edges) {
    edge.edge = removed_edge;
    edge.max_level = GetEdgeMaxLevel(edge.edge);
    AddFaceEdge(&edge, all_edges);
  }
}